

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageViewPrivate::relayoutChildren(PageViewPrivate *this,QRect *r)

{
  QWidget *pQVar1;
  qsizetype qVar2;
  const_reference ppQVar3;
  int local_2c;
  int iMax;
  int i;
  QRect *r_local;
  PageViewPrivate *this_local;
  
  pQVar1 = this->viewport;
  QRect::size(r);
  QWidget::resize((QSize *)pQVar1);
  pQVar1 = this->viewport;
  QRect::topLeft(r);
  QWidget::move((QPoint *)pQVar1);
  local_2c = 0;
  qVar2 = QList<QWidget_*>::count(&this->pages);
  for (; local_2c < (int)qVar2; local_2c = local_2c + 1) {
    ppQVar3 = QList<QWidget_*>::at(&this->pages,(long)local_2c);
    layoutPage(this,*ppQVar3,r);
  }
  layoutControl(this,r);
  return;
}

Assistant:

void
PageViewPrivate::relayoutChildren( const QRect & r )
{
	viewport->resize( r.size() );

	viewport->move( r.topLeft() );

	for( int i = 0, iMax = pages.count(); i < iMax; ++i )
		layoutPage( pages.at( i ), r );

	layoutControl( r );
}